

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmCommonTargetGenerator::ComputeFortranModuleDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmCommonTargetGenerator *this)

{
  cmGeneratorTarget *this_00;
  cmMakefile *this_01;
  bool bVar1;
  char *pcVar2;
  allocator local_89;
  string local_88;
  char *local_68;
  char *moddir_flag;
  allocator local_49;
  string local_48;
  char *local_28;
  char *target_mod_dir;
  cmCommonTargetGenerator *local_18;
  cmCommonTargetGenerator *this_local;
  string *mod_dir;
  
  target_mod_dir._7_1_ = 0;
  local_18 = this;
  this_local = (cmCommonTargetGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  this_00 = this->GeneratorTarget;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"Fortran_MODULE_DIRECTORY",&local_49);
  pcVar2 = cmGeneratorTarget::GetProperty(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  this_01 = this->Makefile;
  local_28 = pcVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"CMAKE_Fortran_MODDIR_FLAG",&local_89);
  pcVar2 = cmMakefile::GetDefinition(this_01,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  if ((local_28 != (char *)0x0) && (pcVar2 != (char *)0x0)) {
    local_68 = pcVar2;
    bVar1 = cmsys::SystemTools::FileIsFullPath(local_28);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_28);
    }
    else {
      pcVar2 = cmLocalGenerator::GetCurrentBinaryDirectory
                         (&this->LocalGenerator->super_cmLocalGenerator);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar2);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_28);
    }
    cmsys::SystemTools::MakeDirectory(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCommonTargetGenerator::ComputeFortranModuleDirectory() const
{
  std::string mod_dir;
  const char* target_mod_dir =
    this->GeneratorTarget->GetProperty("Fortran_MODULE_DIRECTORY");
  const char* moddir_flag =
    this->Makefile->GetDefinition("CMAKE_Fortran_MODDIR_FLAG");
  if(target_mod_dir && moddir_flag)
    {
    // Compute the full path to the module directory.
    if(cmSystemTools::FileIsFullPath(target_mod_dir))
      {
      // Already a full path.
      mod_dir = target_mod_dir;
      }
    else
      {
      // Interpret relative to the current output directory.
      mod_dir = this->LocalGenerator->GetCurrentBinaryDirectory();
      mod_dir += "/";
      mod_dir += target_mod_dir;
      }

    // Make sure the module output directory exists.
    cmSystemTools::MakeDirectory(mod_dir);
    }
  return mod_dir;
}